

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O1

char * StringLooksLikeMacro(s_assenv *ae,char *str,int *retscore)

{
  int iVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  
  if (ae->imacro < 1) {
    iVar3 = 3;
    pcVar4 = (char *)0x0;
  }
  else {
    iVar3 = 3;
    lVar5 = 0;
    lVar2 = 0;
    pcVar4 = (char *)0x0;
    do {
      iVar1 = _internal_LevenshteinDistance(*(char **)((long)&ae->macro->mnemo + lVar5),str);
      if (iVar1 < iVar3) {
        pcVar4 = *(char **)((long)&ae->macro->mnemo + lVar5);
        iVar3 = iVar1;
      }
      lVar2 = lVar2 + 1;
      lVar5 = lVar5 + 0x30;
    } while (lVar2 < ae->imacro);
  }
  if (retscore != (int *)0x0) {
    *retscore = iVar3;
  }
  return pcVar4;
}

Assistant:

char *StringLooksLikeMacro(struct s_assenv *ae, char *str, int *retscore)
{
	#undef FUNC
	#define FUNC "StringLooksLikeMacro"
	
	char *ret=NULL;
	int i,curs,score=3;
	/* search in macros */
	for (i=0;i<ae->imacro;i++) {
		curs=_internal_LevenshteinDistance(ae->macro[i].mnemo,str);
		if (curs<score) {
			score=curs;
			ret=ae->macro[i].mnemo;
		}
	}
	if (retscore) *retscore=score;
	return ret;
}